

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodel_p.h
# Opt level: O3

QFlags<Qt::AlignmentFlag>
QtPrivate::legacyFlagValueFromModelData<QFlags<Qt::AlignmentFlag>>(QVariant *data)

{
  PrivateShared *pPVar1;
  bool bVar2;
  __atomic_base<int> _Var3;
  __atomic_base<int> _Var4;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> QVar5;
  QMetaType QVar6;
  long in_FS_OFFSET;
  ulong local_30;
  QMetaType local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  _Var3._M_i = ::QVariant::typeId(data);
  _Var4._M_i = (__int_type)QMetaTypeInterfaceWrapper<QFlags<Qt::AlignmentFlag>_>::metaType.typeId;
  if ((__atomic_base<int>)
      QMetaTypeInterfaceWrapper<QFlags<Qt::AlignmentFlag>_>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    _Var4._M_i = QMetaType::registerHelper
                           (&QMetaTypeInterfaceWrapper<QFlags<Qt::AlignmentFlag>_>::metaType);
  }
  if (_Var3._M_i == _Var4._M_i) {
    local_28.d_ptr = &QMetaTypeInterfaceWrapper<QFlags<Qt::AlignmentFlag>_>::metaType;
    local_30 = *(ulong *)&(data->d).field_0x18 & 0xfffffffffffffffc;
    bVar2 = comparesEqual((QMetaType *)&local_30,&local_28);
    if (bVar2) {
      if (((data->d).field_0x18 & 1) != 0) {
        pPVar1 = (data->d).data.shared;
        data = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
      }
    }
    else {
      local_30 = local_30 & 0xffffffff00000000;
      QVar6.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if (((data->d).field_0x18 & 1) != 0) {
        pPVar1 = (data->d).data.shared;
        data = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
      }
      QMetaType::convert(QVar6,data,local_28,(PrivateShared *)&local_30);
      data = (QVariant *)&local_30;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
             (QFlagsStorage<Qt::AlignmentFlag>)
             *(QFlagsStorage<Qt::AlignmentFlag> *)
              &((Private *)&((PrivateShared *)data)->field_0x0)->data;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    QVar5.super_QFlagsStorage<Qt::AlignmentFlag>.i =
         (QFlagsStorage<Qt::AlignmentFlag>)::QVariant::toInt((bool *)data);
    return (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
           (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)QVar5.super_QFlagsStorage<Qt::AlignmentFlag>.i
    ;
  }
  __stack_chk_fail();
}

Assistant:

T legacyFlagValueFromModelData(const QVariant &data)
{
    if (data.userType() == qMetaTypeId<T>()) {
        return data.value<T>();
    } else if (std::is_same_v<std::underlying_type_t<typename T::enum_type>, int> ||
               std::is_same_v<std::underlying_type_t<typename T::enum_type>, uint>) {
        return T::fromInt(data.toInt());
    }

    return T();
}